

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

int __thiscall
CTPNSym::gen_code_asi
          (CTPNSym *this,int discard,int phase,tc_asitype_t typ,char *op,CTcPrsNode *rhs,
          int ignore_errors,int xplicit,void **ctx)

{
  int iVar1;
  CTcSymbol *pCVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  CTcPrsSymtab *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined8 in_stack_00000018;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  
  CTcCodeStream::get_symtab(G_cs);
  (*in_RDI->_vptr_CTcPrsSymtab[0xc])();
  (*in_RDI->_vptr_CTcPrsSymtab[0xd])();
  CTcCodeStream::is_self_available(G_cs);
  pCVar2 = CTcPrsSymtab::find_or_def_prop_implied
                     (in_RDI,in_stack_ffffffffffffffa8,
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  iVar1 = (*(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
            [0x19])(pCVar2,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX,in_R8,in_R9,in_stack_00000008,
                    in_stack_00000010,in_stack_00000018);
  return iVar1;
}

Assistant:

int CTPNSym::gen_code_asi(int discard, int phase,
                          tc_asitype_t typ, const char *op,
                          CTcPrsNode *rhs,
                          int ignore_errors, int xplicit, void **ctx)
{
    /* 
     *   Look up the symbol; if it's undefined and there's a "self" object
     *   available, define it as a property by default, since a property
     *   is the only kind of symbol that we could possibly assign to
     *   without having defined anywhere in the program.  Once we have the
     *   symbol, tell it to generate the code for assigning to it.  
     */
    return G_cs->get_symtab()
        ->find_or_def_prop_implied(get_sym_text(), get_sym_text_len(),
                                   FALSE, G_cs->is_self_available())
        ->gen_code_asi(discard, phase, typ, op, rhs,
                       ignore_errors, xplicit, ctx);
}